

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O1

void __thiscall ncnn::Mat::create(Mat *this,int _w,int _h,size_t _elemsize,Allocator *_allocator)

{
  int *piVar1;
  int iVar2;
  ulong uVar3;
  void *ptr;
  void *local_38;
  
  if ((((this->dims != 2) || (this->w != _w)) || (this->h != _h)) ||
     (((this->elemsize != _elemsize || (this->elempack != 1)) || (this->allocator != _allocator))))
  {
    piVar1 = this->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (this->allocator == (Allocator *)0x0) {
          if (this->data != (void *)0x0) {
            free(this->data);
          }
        }
        else {
          (**(code **)(*(long *)this->allocator + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&this->refcount + 4) = 0;
    *(undefined8 *)((long)&this->elemsize + 4) = 0;
    this->data = (void *)0x0;
    this->refcount = (int *)0x0;
    this->dims = 0;
    this->w = 0;
    this->h = 0;
    this->c = 0;
    this->cstep = 0;
    this->elemsize = _elemsize;
    this->elempack = 1;
    this->allocator = _allocator;
    this->dims = 2;
    this->w = _w;
    this->h = _h;
    this->c = 1;
    iVar2 = _h * _w;
    this->cstep = (long)iVar2;
    if (iVar2 != 0) {
      uVar3 = (long)iVar2 * _elemsize + 3 & 0xfffffffffffffffc;
      if (_allocator == (Allocator *)0x0) {
        local_38 = (void *)0x0;
        iVar2 = posix_memalign(&local_38,0x10,uVar3 + 4);
        if (iVar2 != 0) {
          local_38 = (void *)0x0;
        }
      }
      else {
        local_38 = (void *)(**(code **)(*(long *)_allocator + 0x10))(_allocator,uVar3 + 4);
      }
      this->data = local_38;
      this->refcount = (int *)((long)local_38 + uVar3);
      *(undefined4 *)((long)local_38 + uVar3) = 1;
    }
  }
  return;
}

Assistant:

inline void Mat::create(int _w, int _h, size_t _elemsize, Allocator* _allocator)
{
    if (dims == 2 && w == _w && h == _h && elemsize == _elemsize && elempack == 1 && allocator == _allocator)
        return;

    release();

    elemsize = _elemsize;
    elempack = 1;
    allocator = _allocator;

    dims = 2;
    w = _w;
    h = _h;
    c = 1;

    cstep = w * h;

    if (total() > 0)
    {
        size_t totalsize = alignSize(total() * elemsize, 4);
        if (allocator)
            data = allocator->fastMalloc(totalsize + (int)sizeof(*refcount));
        else
            data = fastMalloc(totalsize + (int)sizeof(*refcount));
        refcount = (int*)(((unsigned char*)data) + totalsize);
        *refcount = 1;
    }
}